

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_doors.cpp
# Opt level: O2

void __thiscall DDoor::DoorSound(DDoor *this,bool raise,DSeqNode *curseq)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  bool bVar4;
  int seqnum;
  long lVar5;
  uint mode1;
  ulong uVar6;
  sector_t *sec;
  ushort uVar7;
  char *name;
  FName local_34;
  
  sec = (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector;
  if ((sec->Flags & 0x40) == 0) {
    mode1 = raise ^ 3;
    if (this->m_Speed < 8.0) {
      mode1 = (uint)!raise;
    }
    seqnum = (int)sec->seqType;
    if (-1 < sec->seqType) {
      if (curseq != (DSeqNode *)0x0) {
        bVar4 = SN_AreModesSame(seqnum,SEQ_DOOR,mode1,curseq->m_ModeNum);
        if (bVar4) {
          return;
        }
        sec = (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector;
        seqnum = (int)sec->seqType;
      }
      SN_StartSequence(sec,2,seqnum,SEQ_DOOR,mode1,false);
      return;
    }
    lVar5 = (long)(sec->SeqName).super_FName.Index;
    if (lVar5 == 0) {
      if (gameinfo.gametype == GAME_Heretic) {
        name = "HereticDoor";
      }
      else if (gameinfo.gametype == GAME_Strife) {
        uVar7 = sec->linecount;
        uVar6 = 0;
        if ((short)uVar7 < 1) {
          uVar7 = 0;
        }
        name = "DoorSmallMetal";
        for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
          if ((((sec->lines[uVar6]->backsector != (sector_t *)0x0) &&
               (uVar2 = sec->lines[uVar6]->sidedef[0]->textures[0].texture.texnum,
               uVar2 < TexMan.Textures.Count)) &&
              (TexMan.Textures.Array[(int)uVar2].Texture != (FTexture *)0x0)) &&
             (((pcVar3 = ((TexMan.Textures.Array[(int)uVar2].Texture)->Name).Chars,
               pcVar3 != (char *)0x0 && (*pcVar3 == 'D')) &&
              ((pcVar3[1] == 'O' && (pcVar3[2] == 'R')))))) {
            cVar1 = pcVar3[3];
            if (cVar1 == 'M') {
              if (pcVar3[4] == 'L') {
                name = "DoorLargeMetal";
              }
            }
            else if (cVar1 == 'W') {
              name = "DoorSmallWood";
              if (pcVar3[4] == 'L') {
                name = "DoorLargeWood";
              }
            }
            else if (cVar1 == 'S') {
              name = "DoorStone";
            }
          }
        }
      }
      else {
        name = "DoorNormal";
      }
      if (curseq != (DSeqNode *)0x0) {
        bVar4 = SN_AreModesSame(name,mode1,curseq->m_ModeNum);
        if (bVar4) {
          return;
        }
        sec = (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector;
      }
      SN_StartSequence(sec,2,name,mode1);
      return;
    }
    if (curseq != (DSeqNode *)0x0) {
      bVar4 = SN_AreModesSame(FName::NameData.NameArray[lVar5].Text,mode1,curseq->m_ModeNum);
      if (bVar4) {
        return;
      }
      sec = (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector;
    }
    SN_StartSequence(sec,2,&local_34,mode1);
  }
  return;
}

Assistant:

void DDoor::DoorSound(bool raise, DSeqNode *curseq) const
{
	int choice;

	// For multiple-selection sound sequences, the following choices are used:
	//  0  Opening
	//  1  Closing
	//  2  Opening fast
	//  3  Closing fast

	choice = !raise;

	if (m_Sector->Flags & SECF_SILENTMOVE) return;

	if (m_Speed >= 8)
	{
		choice += 2;
	}

	if (m_Sector->seqType >= 0)
	{
		if (curseq == NULL || !SN_AreModesSame(m_Sector->seqType, SEQ_DOOR, choice, curseq->GetModeNum()))
		{
			SN_StartSequence(m_Sector, CHAN_CEILING, m_Sector->seqType, SEQ_DOOR, choice);
		}
	}
	else if (m_Sector->SeqName != NAME_None)
	{
		if (curseq == NULL || !SN_AreModesSame(m_Sector->SeqName, choice, curseq->GetModeNum()))
		{
			SN_StartSequence(m_Sector, CHAN_CEILING, m_Sector->SeqName, choice);
		}
	}
	else
	{
		const char *snd;

		switch (gameinfo.gametype)
		{
		default:	/* Doom and Hexen */
			snd = "DoorNormal";
			break;
			
		case GAME_Heretic:
			snd = "HereticDoor";
			break;

		case GAME_Strife:
			snd = "DoorSmallMetal";

			// Search the front top textures of 2-sided lines on the door sector
			// for a door sound to use.
			for (int i = 0; i < m_Sector->linecount; ++i)
			{
				const char *texname;
				line_t *line = m_Sector->lines[i];

				if (line->backsector == NULL)
					continue;

				FTexture *tex = TexMan[line->sidedef[0]->GetTexture(side_t::top)];
				texname = tex ? tex->Name.GetChars() : NULL;
				if (texname != NULL && texname[0] == 'D' && texname[1] == 'O' && texname[2] == 'R')
				{
					switch (texname[3])
					{
					case 'S':
						snd = "DoorStone";
						break;

					case 'M':
						if (texname[4] == 'L')
						{
							snd = "DoorLargeMetal";
						}
						break;

					case 'W':
						if (texname[4] == 'L')
						{
							snd = "DoorLargeWood";
						}
						else
						{
							snd = "DoorSmallWood";
						}
						break;
					}
				}
			}
			break;
		}
		if (curseq == NULL || !SN_AreModesSame(snd, choice, curseq->GetModeNum()))
		{
			SN_StartSequence(m_Sector, CHAN_CEILING, snd, choice);
		}
	}
}